

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgtool.cpp
# Opt level: O0

int falsecolor(int argc,char **argv)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v;
  initializer_list<float> v_00;
  Point2i p;
  Point2i p_00;
  Allocator alloc;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  ulong uVar5;
  float *pfVar6;
  size_type sVar7;
  const_reference pvVar8;
  long *in_RSI;
  int iVar9;
  RGB *this;
  Float FVar10;
  float fVar11;
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar12 [16];
  undefined1 extraout_var [56];
  undefined1 auVar13 [64];
  ColorEncodingHandle *in_stack_000000e8;
  string *in_stack_000000f0;
  Allocator in_stack_000000f8;
  int index;
  RGB rgb;
  Float relativeValue;
  int x_1;
  int y_1;
  Image outImage;
  int x;
  int y;
  Image *image;
  ImageAndMetadata im;
  anon_class_1_0_00000001 onError;
  Float maxValue;
  bool plusMinus;
  string inFile;
  string outFile;
  nullptr_t in_stack_fffffffffffff648;
  undefined8 uVar14;
  ImageAndMetadata *in_stack_fffffffffffff650;
  undefined4 in_stack_fffffffffffff658;
  WrapMode in_stack_fffffffffffff65c;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *in_stack_fffffffffffff660;
  undefined7 in_stack_fffffffffffff680;
  undefined1 in_stack_fffffffffffff687;
  undefined1 in_stack_fffffffffffff688 [64];
  vector<pbrt::RGB,_std::allocator<pbrt::RGB>_> *in_stack_fffffffffffff738;
  array<pbrt::WrapMode,_2> in_stack_fffffffffffff740;
  float in_stack_fffffffffffff748;
  float in_stack_fffffffffffff74c;
  ColorEncodingHandle *in_stack_fffffffffffff760;
  PixelFormat in_stack_fffffffffffff76c;
  Image *in_stack_fffffffffffff770;
  undefined4 in_stack_fffffffffffff778;
  undefined4 in_stack_fffffffffffff77c;
  undefined8 in_stack_fffffffffffff780;
  undefined4 in_stack_fffffffffffff788;
  undefined4 in_stack_fffffffffffff78c;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffff790;
  string *local_848;
  undefined4 in_stack_fffffffffffff820;
  undefined4 in_stack_fffffffffffff824;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff828;
  undefined7 in_stack_fffffffffffff830;
  byte in_stack_fffffffffffff837;
  char ***in_stack_fffffffffffff838;
  bool local_791;
  optional<float> local_770;
  aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)> local_768;
  undefined4 local_728;
  aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)> local_724;
  undefined4 local_6e4;
  aligned_storage_t<sizeof(pbrt::Bounds2<int>),_alignof(pbrt::Bounds2<int>)> local_6e0;
  undefined4 local_6d0;
  aligned_storage_t<sizeof(pbrt::Point2<int>),_alignof(pbrt::Point2<int>)> local_6cc;
  undefined4 local_6c4;
  optional<int> local_6c0;
  optional<float> local_6b8;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
  local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 uStack_680;
  undefined8 uStack_678;
  Float local_66c;
  Float local_668;
  Float local_664;
  Float *local_660;
  undefined8 local_658;
  int local_634;
  int local_630;
  RGB local_62c;
  RGB local_620;
  RGB local_614 [6];
  float local_5c4;
  Tuple2<pbrt::Point2,_int> local_5c0;
  int local_5b8;
  Tuple2<pbrt::Point2,_int> local_5b4;
  int local_5ac;
  undefined8 local_5a8;
  undefined1 local_594;
  allocator<char> local_593;
  allocator<char> local_592;
  allocator<char> local_591;
  string *local_590;
  string local_588 [32];
  undefined1 local_568 [32];
  undefined1 local_548 [32];
  string *local_528;
  undefined8 local_520;
  Tuple2<pbrt::Point2,_int> local_508;
  undefined1 local_3d8 [52];
  Float local_3a4;
  Tuple2<pbrt::Point2,_int> local_3a0;
  int local_398;
  Tuple2<pbrt::Point2,_int> local_394;
  int local_38c;
  Image *local_388;
  Image local_370;
  byte local_151;
  ImageMetadata *in_stack_fffffffffffffeb0;
  string *in_stack_fffffffffffffeb8;
  Image *in_stack_fffffffffffffec0;
  allocator<char> local_129;
  string local_128 [39];
  byte local_101;
  byte local_db;
  byte local_da;
  allocator<char> local_d9;
  string local_d8 [87];
  allocator<char> local_81;
  string local_80 [40];
  float local_58;
  byte local_51;
  string local_50 [32];
  string local_30 [32];
  long *local_10;
  uint local_4;
  
  local_10 = in_RSI;
  std::__cxx11::string::string(local_30);
  std::__cxx11::string::string(local_50);
  local_51 = 0;
  local_58 = -INFINITY;
  while (*local_10 != 0) {
    std::allocator<char>::allocator();
    local_da = 0;
    local_db = 0;
    local_101 = 0;
    bVar1 = false;
    bVar3 = false;
    local_151 = 0;
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff688._8_8_,in_stack_fffffffffffff688._0_8_,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680));
    std::function<void(std::__cxx11::string)>::function<falsecolor(int,char**)::__0&,void>
              (in_stack_fffffffffffff660,
               (anon_class_1_0_00000001 *)
               CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658));
    bVar2 = pbrt::ParseArg<std::__cxx11::string*>
                      (in_stack_fffffffffffff838,
                       (string *)CONCAT17(in_stack_fffffffffffff837,in_stack_fffffffffffff830),
                       in_stack_fffffffffffff828,
                       (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                        *)CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820));
    local_791 = true;
    if (!bVar2) {
      std::allocator<char>::allocator();
      local_da = 1;
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff688._8_8_,in_stack_fffffffffffff688._0_8_,
                 (allocator<char> *)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680));
      local_db = 1;
      std::function<void(std::__cxx11::string)>::function<falsecolor(int,char**)::__0&,void>
                (in_stack_fffffffffffff660,
                 (anon_class_1_0_00000001 *)
                 CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658));
      local_101 = 1;
      bVar2 = pbrt::ParseArg<bool*>
                        (in_stack_fffffffffffff838,
                         (string *)CONCAT17(in_stack_fffffffffffff837,in_stack_fffffffffffff830),
                         (bool *)in_stack_fffffffffffff828,
                         (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                          *)CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820));
      local_791 = true;
      if (!bVar2) {
        std::allocator<char>::allocator();
        bVar1 = true;
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff688._8_8_,in_stack_fffffffffffff688._0_8_,
                   (allocator<char> *)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680))
        ;
        bVar3 = true;
        in_stack_fffffffffffff838 = (char ***)&stack0xfffffffffffffeb0;
        std::function<void(std::__cxx11::string)>::function<falsecolor(int,char**)::__0&,void>
                  (in_stack_fffffffffffff660,
                   (anon_class_1_0_00000001 *)
                   CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658));
        local_151 = 1;
        local_791 = pbrt::ParseArg<float*>
                              (in_stack_fffffffffffff838,
                               (string *)
                               CONCAT17(in_stack_fffffffffffff837,in_stack_fffffffffffff830),
                               (float *)in_stack_fffffffffffff828,
                               (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                *)CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820));
      }
    }
    in_stack_fffffffffffff837 = local_791;
    if ((local_151 & 1) != 0) {
      std::
      function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
      ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                   *)0x3da062);
      in_stack_fffffffffffff837 = local_791;
    }
    if (bVar3) {
      std::__cxx11::string::~string(local_128);
    }
    if (bVar1) {
      std::allocator<char>::~allocator(&local_129);
    }
    if ((local_101 & 1) != 0) {
      std::
      function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
      ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                   *)0x3da0ad);
    }
    if ((local_db & 1) != 0) {
      std::__cxx11::string::~string(local_d8);
    }
    if ((local_da & 1) != 0) {
      std::allocator<char>::~allocator(&local_d9);
    }
    std::
    function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
    ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                 *)0x3da0ec);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator(&local_81);
    if ((in_stack_fffffffffffff837 & 1) == 0) {
      uVar5 = std::__cxx11::string::empty();
      if (((uVar5 & 1) == 0) || (*(char *)*local_10 == '-')) {
        usage("falsecolor","%s: unknown command flag",*local_10);
      }
      else {
        std::__cxx11::string::operator=(local_50,(char *)*local_10);
        local_10 = local_10 + 1;
      }
    }
  }
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) != 0) {
    usage("falsecolor","expecting input image filename.");
  }
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) != 0) {
    usage("falsecolor","expecting --outfile filename.");
  }
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
            ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffff650);
  pbrt::ColorEncodingHandle::TaggedPointer
            ((ColorEncodingHandle *)in_stack_fffffffffffff650,in_stack_fffffffffffff648);
  pbrt::Image::Read(in_stack_000000f0,in_stack_000000f8,in_stack_000000e8);
  local_388 = &local_370;
  if ((local_58 == -INFINITY) && (!NAN(local_58))) {
    local_38c = 0;
    while( true ) {
      iVar9 = local_38c;
      local_394 = (Tuple2<pbrt::Point2,_int>)pbrt::Image::Resolution(local_388);
      if (local_394.y <= iVar9) break;
      local_398 = 0;
      while( true ) {
        iVar9 = local_398;
        local_3a0 = (Tuple2<pbrt::Point2,_int>)pbrt::Image::Resolution(local_388);
        if (local_3a0.x <= iVar9) break;
        pbrt::Point2<int>::Point2
                  ((Point2<int> *)in_stack_fffffffffffff650,
                   (int)((ulong)in_stack_fffffffffffff648 >> 0x20),(int)in_stack_fffffffffffff648);
        pbrt::WrapMode2D::WrapMode2D
                  ((WrapMode2D *)in_stack_fffffffffffff660,in_stack_fffffffffffff65c);
        p.super_Tuple2<pbrt::Point2,_int>.y = (int)in_stack_fffffffffffff74c;
        p.super_Tuple2<pbrt::Point2,_int>.x = (int)in_stack_fffffffffffff748;
        pbrt::Image::GetChannels
                  ((Image *)in_stack_fffffffffffff738,p,(WrapMode2D)in_stack_fffffffffffff740.values
                  );
        iVar9 = (int)local_3d8;
        FVar10 = pbrt::ImageChannelValues::Average((ImageChannelValues *)in_stack_fffffffffffff660);
        std::abs(iVar9);
        local_3a4 = FVar10;
        pfVar6 = std::max<float>(&local_58,&local_3a4);
        local_58 = *pfVar6;
        pbrt::ImageChannelValues::~ImageChannelValues((ImageChannelValues *)0x3da56e);
        local_398 = local_398 + 1;
      }
      local_38c = local_38c + 1;
    }
  }
  local_508 = (Tuple2<pbrt::Point2,_int>)pbrt::Image::Resolution(local_388);
  local_594 = 1;
  local_590 = local_588;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff688._8_8_,in_stack_fffffffffffff688._0_8_,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680));
  local_590 = (string *)local_568;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff688._8_8_,in_stack_fffffffffffff688._0_8_,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680));
  local_590 = (string *)local_548;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff688._8_8_,in_stack_fffffffffffff688._0_8_,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680));
  local_594 = 0;
  local_528 = local_588;
  local_520 = 3;
  v._M_array._4_4_ = in_stack_fffffffffffff65c;
  v._M_array._0_4_ = in_stack_fffffffffffff658;
  v._M_len = (size_type)in_stack_fffffffffffff660;
  pstd::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)in_stack_fffffffffffff650,v);
  pbrt::ColorEncodingHandle::TaggedPointer
            ((ColorEncodingHandle *)in_stack_fffffffffffff650,in_stack_fffffffffffff648);
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
            ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffff650);
  channels.n._0_4_ = in_stack_fffffffffffff788;
  channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff780;
  channels.n._4_4_ = in_stack_fffffffffffff78c;
  alloc.memoryResource._4_4_ = in_stack_fffffffffffff77c;
  alloc.memoryResource._0_4_ = in_stack_fffffffffffff778;
  pbrt::Image::Image(in_stack_fffffffffffff770,in_stack_fffffffffffff76c,
                     (Point2i)in_stack_fffffffffffff790,channels,in_stack_fffffffffffff760,alloc);
  local_848 = (string *)&local_528;
  uVar14 = local_5a8;
  do {
    local_848 = local_848 + -0x20;
    std::__cxx11::string::~string(local_848);
  } while (local_848 != local_588);
  std::allocator<char>::~allocator(&local_593);
  std::allocator<char>::~allocator(&local_592);
  std::allocator<char>::~allocator(&local_591);
  auVar13._8_56_ = extraout_var;
  auVar13._0_8_ = extraout_XMM1_Qa;
  local_5ac = 0;
  while( true ) {
    iVar9 = local_5ac;
    local_5b4 = (Tuple2<pbrt::Point2,_int>)pbrt::Image::Resolution(local_388);
    if (local_5b4.y <= iVar9) break;
    local_5b8 = 0;
    while( true ) {
      iVar9 = local_5b8;
      local_5c0 = (Tuple2<pbrt::Point2,_int>)pbrt::Image::Resolution(local_388);
      auVar12 = auVar13._0_16_;
      if (local_5c0.x <= iVar9) break;
      pbrt::Point2<int>::Point2
                ((Point2<int> *)in_stack_fffffffffffff650,(int)((ulong)uVar14 >> 0x20),(int)uVar14);
      pbrt::WrapMode2D::WrapMode2D
                ((WrapMode2D *)in_stack_fffffffffffff660,in_stack_fffffffffffff65c);
      p_00.super_Tuple2<pbrt::Point2,_int>.y = (int)in_stack_fffffffffffff74c;
      p_00.super_Tuple2<pbrt::Point2,_int>.x = (int)in_stack_fffffffffffff748;
      pbrt::Image::GetChannels
                ((Image *)in_stack_fffffffffffff738,p_00,
                 (WrapMode2D)in_stack_fffffffffffff740.values);
      FVar10 = pbrt::ImageChannelValues::Average((ImageChannelValues *)in_stack_fffffffffffff660);
      fVar11 = FVar10 / local_58;
      pbrt::ImageChannelValues::~ImageChannelValues((ImageChannelValues *)0x3da95b);
      this = local_614;
      local_5c4 = fVar11;
      pbrt::RGB::RGB(this);
      if ((local_51 & 1) == 0) {
        fVar11 = pbrt::Clamp<float,int,int>(local_5c4,0,1);
        in_stack_fffffffffffff738 = &falseColorValues;
        in_stack_fffffffffffff748 = fVar11;
        local_5c4 = fVar11;
        sVar7 = std::vector<pbrt::RGB,_std::allocator<pbrt::RGB>_>::size(&falseColorValues);
        auVar12 = vcvtusi2ss_avx512f(auVar12,sVar7);
        auVar13 = ZEXT1664(auVar12);
        local_630 = (int)(fVar11 * auVar12._0_4_);
        sVar7 = std::vector<pbrt::RGB,_std::allocator<pbrt::RGB>_>::size(in_stack_fffffffffffff738);
        local_634 = (int)sVar7 + -1;
        in_stack_fffffffffffff740.values = (WrapMode  [2])std::min<int>(&local_630,&local_634);
        local_630 = *(int *)in_stack_fffffffffffff740.values;
        pvVar8 = std::vector<pbrt::RGB,_std::allocator<pbrt::RGB>_>::operator[]
                           (&falseColorValues,(long)local_630);
        local_614[0].r = pvVar8->r;
        local_614[0].g = pvVar8->g;
        local_614[0].b = pvVar8->b;
      }
      else if (local_5c4 <= 0.0) {
        in_stack_fffffffffffff74c = local_5c4;
        std::abs((int)this);
        auVar13 = ZEXT1664((undefined1  [16])0x0);
        pbrt::RGB::RGB(&local_62c,in_stack_fffffffffffff74c,0.0,0.0);
        local_614[0].r = local_62c.r;
        local_614[0].g = local_62c.g;
        local_614[0].b = local_62c.b;
      }
      else {
        auVar13 = ZEXT464((uint)local_5c4);
        pbrt::RGB::RGB(&local_620,0.0,local_5c4,0.0);
        local_614[0].r = local_620.r;
        local_614[0].g = local_620.g;
        local_614[0].b = local_620.b;
      }
      pbrt::Point2<int>::Point2
                ((Point2<int> *)in_stack_fffffffffffff650,(int)((ulong)uVar14 >> 0x20),(int)uVar14);
      pbrt::RGB::operator[](local_614,0);
      local_66c = pbrt::SRGBToLinear(5.66399e-39);
      pbrt::RGB::operator[](local_614,1);
      local_668 = pbrt::SRGBToLinear(5.664116e-39);
      pbrt::RGB::operator[](local_614,2);
      local_664 = pbrt::SRGBToLinear(5.664246e-39);
      local_660 = &local_66c;
      local_658 = 3;
      v_00._M_array._4_4_ = in_stack_fffffffffffff65c;
      v_00._M_array._0_4_ = in_stack_fffffffffffff658;
      v_00._M_len = (size_type)in_stack_fffffffffffff660;
      pstd::span<const_float>::span((span<const_float> *)in_stack_fffffffffffff650,v_00);
      pbrt::Image::SetChannels
                (in_stack_fffffffffffff688._24_8_,(Point2i)in_stack_fffffffffffff688._48_8_,
                 in_stack_fffffffffffff688._32_16_);
      local_5b8 = local_5b8 + 1;
    }
    local_5ac = local_5ac + 1;
  }
  local_770.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
  local_770.set = false;
  local_770._5_3_ = 0;
  pstd::optional<float>::optional(&local_770);
  auVar13 = ZEXT1664((undefined1  [16])0x0);
  local_768 = (aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)>)
              vmovdqu64_avx512f(auVar13);
  local_728 = 0;
  pstd::optional<pbrt::SquareMatrix<4>_>::optional
            ((optional<pbrt::SquareMatrix<4>_> *)&local_768.__align);
  local_724 = (aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)>)
              vmovdqu64_avx512f(auVar13);
  local_6e4 = 0;
  pstd::optional<pbrt::SquareMatrix<4>_>::optional
            ((optional<pbrt::SquareMatrix<4>_> *)&local_724.__align);
  local_6e0 = (aligned_storage_t<sizeof(pbrt::Bounds2<int>),_alignof(pbrt::Bounds2<int>)>)0x0;
  local_6d0 = 0;
  pstd::optional<pbrt::Bounds2<int>_>::optional((optional<pbrt::Bounds2<int>_> *)&local_6e0.__align)
  ;
  local_6c4 = 0;
  local_6cc = (aligned_storage_t<sizeof(pbrt::Point2<int>),_alignof(pbrt::Point2<int>)>)0x0;
  pstd::optional<pbrt::Point2<int>_>::optional((optional<pbrt::Point2<int>_> *)&local_6cc.__align);
  local_6c0.optionalValue = (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
  local_6c0.set = false;
  local_6c0._5_3_ = 0;
  pstd::optional<int>::optional(&local_6c0);
  local_6b8.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
  local_6b8.set = false;
  local_6b8._5_3_ = 0;
  pstd::optional<float>::optional(&local_6b8);
  local_6b0 = (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
               )0x0;
  uStack_6a8 = 0;
  pstd::optional<const_pbrt::RGBColorSpace_*>::optional
            ((optional<const_pbrt::RGBColorSpace_*> *)&local_6b0.__align);
  uStack_680 = 0;
  uStack_678 = 0;
  local_6a0 = 0;
  uStack_698 = 0;
  uStack_690 = 0;
  uStack_688 = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
         *)0x3daf99);
  bVar3 = pbrt::Image::Write(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                             in_stack_fffffffffffffeb0);
  bVar4 = bVar3 ^ 0xff;
  pbrt::ImageMetadata::~ImageMetadata((ImageMetadata *)in_stack_fffffffffffff650);
  local_4 = (uint)((bVar4 & 1) != 0);
  pbrt::Image::~Image(&in_stack_fffffffffffff650->image);
  pbrt::ImageAndMetadata::~ImageAndMetadata(in_stack_fffffffffffff650);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  return local_4;
}

Assistant:

int falsecolor(int argc, char *argv[]) {
    std::string outFile, inFile;
    bool plusMinus = false;
    Float maxValue = -Infinity;

    while (*argv != nullptr) {
        auto onError = [](const std::string &err) {
            usage("falsecolor", "%s", err.c_str());
            exit(1);
        };

        if (ParseArg(&argv, "outfile", &outFile, onError) ||
            ParseArg(&argv, "plusminus", &plusMinus, onError) ||
            ParseArg(&argv, "maxValue", &maxValue, onError)) {
            // success
        } else if (inFile.empty() && argv[0][0] != '-') {
            inFile = *argv;
            ++argv;
        } else {
            usage("falsecolor", "%s: unknown command flag", *argv);
        }
    }

    if (inFile.empty())
        usage("falsecolor", "expecting input image filename.");
    if (outFile.empty())
        usage("falsecolor", "expecting --outfile filename.");

    ImageAndMetadata im = Image::Read(inFile);
    const Image &image = im.image;

    if (maxValue == -Infinity)
        for (int y = 0; y < image.Resolution().y; ++y)
            for (int x = 0; x < image.Resolution().x; ++x)
                maxValue =
                    std::max(maxValue, std::abs(image.GetChannels({x, y}).Average()));

    Image outImage(PixelFormat::Half, image.Resolution(), {"R", "G", "B"});
    for (int y = 0; y < image.Resolution().y; ++y)
        for (int x = 0; x < image.Resolution().x; ++x) {
            Float relativeValue = image.GetChannels({x, y}).Average() / maxValue;
            RGB rgb;
            if (plusMinus) {
                if (relativeValue > 0)
                    rgb = RGB(0, relativeValue, 0);
                else
                    rgb = RGB(std::abs(relativeValue), 0, 0);
            } else {
                relativeValue = Clamp(relativeValue, 0, 1);
                int index = relativeValue * falseColorValues.size();
                index = std::min<int>(index, falseColorValues.size() - 1);
                rgb = falseColorValues[index];
            }

            outImage.SetChannels({x, y}, {SRGBToLinear(rgb[0]), SRGBToLinear(rgb[1]),
                                          SRGBToLinear(rgb[2])});
        }

    if (!outImage.Write(outFile))
        return 1;

    return 0;
}